

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x86emithelper.cpp
# Opt level: O2

Error __thiscall
asmjit::_abi_1_10::x86::EmitHelper::emitRegMove
          (EmitHelper *this,Operand_ *dst_,Operand_ *src_,TypeId typeId,char *comment)

{
  char cVar1;
  BaseEmitter *this_00;
  undefined8 uVar2;
  uint32_t value;
  Error EVar3;
  InstId IVar4;
  InstId instId;
  byte bVar5;
  bool bVar6;
  Operand dst;
  Operand src;
  
  if (((byte)(typeId + ~_kVec512End) < 0xbb) || ((typeId & 0x7e) == _kBaseStart)) {
    DebugUtils::assertionFailed
              ("/workspace/llm4binary/github/license_c_cmakelists/mitsuba-renderer[P]asmjit/src/asmjit/x86/x86emithelper.cpp"
               ,0x38,"TypeUtils::isValid(typeId) && !TypeUtils::isAbstract(typeId)");
  }
  dst.super_Operand_._signature._bits = (dst_->_signature)._bits;
  dst.super_Operand_._baseId = dst_->_baseId;
  dst.super_Operand_._data = *&dst_->_data;
  uVar2._0_4_ = (src_->_signature)._bits;
  uVar2._4_4_ = src_->_baseId;
  src.super_Operand_._data = *&src_->_data;
  bVar5 = (dst.super_Operand_._signature._bits & 7) == 2;
  src.super_Operand_._0_8_ = uVar2;
  if ((bool)bVar5) {
    OperandSignature::setField<4278190080u,24u>((OperandSignature *)&dst,uVar2._0_4_ >> 0x18);
  }
  if ((uVar2._0_4_ & 7) == 2) {
    bVar5 = bVar5 | 2;
    OperandSignature::setField<4278190080u,24u>
              ((OperandSignature *)&src,(uint)dst.super_Operand_._signature._bits._3_1_);
  }
  instId = 0x1a2;
  switch(typeId) {
  case kInt8:
  case kUInt8:
  case kInt16:
  case kUInt16:
    if ((bVar5 & 2) == 0) {
      if (bVar5 == 0) {
        dst.super_Operand_._signature._bits = 0x4000031;
        src.super_Operand_._signature._bits = 0x4000031;
      }
    }
    else {
      dst.super_Operand_._signature._bits = 0x4000031;
      instId = 0x1c9;
    }
    break;
  case kInt32:
  case kUInt32:
  case kInt64:
  case _kIntEnd:
    break;
  default:
    cVar1 = TypeUtils::_typeData[typeId];
    if (bVar5 == 0 || 9 < (byte)(typeId - _kVec32Start)) {
      if (9 < (byte)(typeId - _kVec64Start) || bVar5 == 0) {
        if (cVar1 == '+') {
          bVar6 = this->_avxEnabled == false;
          IVar4 = 0x481;
          instId = 0x1a4;
        }
        else if (cVar1 == '*') {
          bVar6 = this->_avxEnabled == false;
          IVar4 = 0x482;
          instId = 0x1a5;
        }
        else {
          instId = 0x486;
          if (this->_avx512Enabled != false) break;
          bVar6 = this->_avxEnabled == false;
          IVar4 = 0x485;
          instId = 0x1ac;
        }
        if (!bVar6) {
          instId = IVar4;
        }
        break;
      }
      bVar6 = (this->_avxEnabled & 1U) != 0;
      IVar4 = 0x1c1;
      if (bVar6) {
        IVar4 = 0x49a;
      }
      instId = 0x1be;
      if (bVar6) {
        instId = 0x499;
      }
      if (cVar1 == '+') {
        instId = IVar4;
      }
      value = 8;
    }
    else {
      bVar6 = (this->_avxEnabled & 1U) != 0;
      IVar4 = 0x1c4;
      if (bVar6) {
        IVar4 = 0x49e;
      }
      instId = 0x1a7;
      if (bVar6) {
        instId = 0x483;
      }
      if (cVar1 == '*') {
        instId = IVar4;
      }
      value = 4;
    }
    if ((dst.super_Operand_._signature._bits & 7) == 2) {
      OperandSignature::setField<4278190080u,24u>((OperandSignature *)&dst,value);
    }
    if ((src.super_Operand_._signature._bits & 7) == 2) {
      OperandSignature::setField<4278190080u,24u>((OperandSignature *)&src,value);
    }
    break;
  case _kMaskStart:
    instId = 0x150;
    break;
  case kMask16:
    instId = 0x153;
    break;
  case kMask32:
    instId = 0x151;
    break;
  case _kMaskEnd:
    instId = 0x152;
    break;
  case _kMmxStart:
    instId = 0x1a7;
    if (bVar5 != 0) break;
  case _kMmxEnd:
    instId = 0x1be;
  }
  this_00 = (this->super_BaseEmitHelper)._emitter;
  this_00->_inlineComment = comment;
  EVar3 = BaseEmitter::_emitI(this_00,instId,&dst.super_Operand_,&src.super_Operand_);
  return EVar3;
}

Assistant:

ASMJIT_FAVOR_SIZE Error EmitHelper::emitRegMove(
  const Operand_& dst_,
  const Operand_& src_, TypeId typeId, const char* comment) {

  // Invalid or abstract TypeIds are not allowed.
  ASMJIT_ASSERT(TypeUtils::isValid(typeId) && !TypeUtils::isAbstract(typeId));

  Operand dst(dst_);
  Operand src(src_);

  InstId instId = Inst::kIdNone;
  uint32_t memFlags = 0;
  uint32_t overrideMemSize = 0;

  enum MemFlags : uint32_t {
    kDstMem = 0x1,
    kSrcMem = 0x2
  };

  // Detect memory operands and patch them to have the same size as the register. BaseCompiler always sets memory size
  // of allocs and spills, so it shouldn't be really necessary, however, after this function was separated from Compiler
  // it's better to make sure that the size is always specified, as we can use 'movzx' and 'movsx' that rely on it.
  if (dst.isMem()) { memFlags |= kDstMem; dst.as<Mem>().setSize(src.size()); }
  if (src.isMem()) { memFlags |= kSrcMem; src.as<Mem>().setSize(dst.size()); }

  switch (typeId) {
    case TypeId::kInt8:
    case TypeId::kUInt8:
    case TypeId::kInt16:
    case TypeId::kUInt16:
      // Special case - 'movzx' load.
      if (memFlags & kSrcMem) {
        instId = Inst::kIdMovzx;
        dst.setSignature(Reg::signatureOfT<RegType::kX86_Gpd>());
        break;
      }

      if (!memFlags) {
        // Change both destination and source registers to GPD (safer, no dependencies).
        dst.setSignature(Reg::signatureOfT<RegType::kX86_Gpd>());
        src.setSignature(Reg::signatureOfT<RegType::kX86_Gpd>());
      }
      ASMJIT_FALLTHROUGH;

    case TypeId::kInt32:
    case TypeId::kUInt32:
    case TypeId::kInt64:
    case TypeId::kUInt64:
      instId = Inst::kIdMov;
      break;

    case TypeId::kMmx32:
      instId = Inst::kIdMovd;
      if (memFlags) break;
      ASMJIT_FALLTHROUGH;

    case TypeId::kMmx64 : instId = Inst::kIdMovq ; break;
    case TypeId::kMask8 : instId = Inst::kIdKmovb; break;
    case TypeId::kMask16: instId = Inst::kIdKmovw; break;
    case TypeId::kMask32: instId = Inst::kIdKmovd; break;
    case TypeId::kMask64: instId = Inst::kIdKmovq; break;

    default: {
      TypeId scalarTypeId = TypeUtils::scalarOf(typeId);
      if (TypeUtils::isVec32(typeId) && memFlags) {
        overrideMemSize = 4;
        if (scalarTypeId == TypeId::kFloat32)
          instId = _avxEnabled ? Inst::kIdVmovss : Inst::kIdMovss;
        else
          instId = _avxEnabled ? Inst::kIdVmovd : Inst::kIdMovd;
        break;
      }

      if (TypeUtils::isVec64(typeId) && memFlags) {
        overrideMemSize = 8;
        if (scalarTypeId == TypeId::kFloat64)
          instId = _avxEnabled ? Inst::kIdVmovsd : Inst::kIdMovsd;
        else
          instId = _avxEnabled ? Inst::kIdVmovq : Inst::kIdMovq;
        break;
      }

      if (scalarTypeId == TypeId::kFloat32)
        instId = _avxEnabled ? Inst::kIdVmovaps : Inst::kIdMovaps;
      else if (scalarTypeId == TypeId::kFloat64)
        instId = _avxEnabled ? Inst::kIdVmovapd : Inst::kIdMovapd;
      else if (!_avx512Enabled)
        instId = _avxEnabled ? Inst::kIdVmovdqa : Inst::kIdMovdqa;
      else
        instId = Inst::kIdVmovdqa32;
      break;
    }
  }

  if (!instId)
    return DebugUtils::errored(kErrorInvalidState);

  if (overrideMemSize) {
    if (dst.isMem()) dst.as<Mem>().setSize(overrideMemSize);
    if (src.isMem()) src.as<Mem>().setSize(overrideMemSize);
  }

  _emitter->setInlineComment(comment);
  return _emitter->emit(instId, dst, src);
}